

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O1

void __thiscall cmCTestLaunch::LoadScrapeRules(cmCTestLaunch *this)

{
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *this_00;
  
  if (this->ScrapeRulesLoaded != false) {
    return;
  }
  this->ScrapeRulesLoaded = true;
  this_00 = &this->RegexWarning;
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<char_const(&)[37]>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)this_00,
             (char (*) [37])"(^|[ :])[Ww][Aa][Rr][Nn][Ii][Nn][Gg]");
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<char_const(&)[33]>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)this_00,
             (char (*) [33])"(^|[ :])[Rr][Ee][Mm][Aa][Rr][Kk]");
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<char_const(&)[25]>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)this_00,
             (char (*) [25])"(^|[ :])[Nn][Oo][Tt][Ee]");
  LoadScrapeRules(this,"Warning",this_00);
  LoadScrapeRules(this,"WarningSuppress",&this->RegexWarningSuppress);
  return;
}

Assistant:

void cmCTestLaunch::LoadScrapeRules()
{
  if (this->ScrapeRulesLoaded) {
    return;
  }
  this->ScrapeRulesLoaded = true;

  // Common compiler warning formats.  These are much simpler than the
  // full log-scraping expressions because we do not need to extract
  // file and line information.
  this->RegexWarning.emplace_back("(^|[ :])[Ww][Aa][Rr][Nn][Ii][Nn][Gg]");
  this->RegexWarning.emplace_back("(^|[ :])[Rr][Ee][Mm][Aa][Rr][Kk]");
  this->RegexWarning.emplace_back("(^|[ :])[Nn][Oo][Tt][Ee]");

  // Load custom match rules given to us by CTest.
  this->LoadScrapeRules("Warning", this->RegexWarning);
  this->LoadScrapeRules("WarningSuppress", this->RegexWarningSuppress);
}